

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall CLPIParser::composeExtentStartPoint(CLPIParser *this,BitStreamWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  size_type sVar7;
  reference piVar8;
  int *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  uint32_t sum;
  int beforeCount;
  uint32_t *lengthPos;
  BitStreamWriter *writer_local;
  CLPIParser *this_local;
  
  puVar6 = BitStream::getBuffer(&writer->super_BitStream);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,0x20,0);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,0x10,0);
  sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->interleaveInfo);
  BitStreamWriter::putBits(writer,0x10,(uint)sVar7);
  __range1._0_4_ = 0;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->interleaveInfo);
  i = (int *)std::vector<int,_std::allocator<int>_>::end(&this->interleaveInfo);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&i);
    if (!bVar1) break;
    piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    __range1._0_4_ = *piVar8 + (uint)__range1;
    BitStreamWriter::putBits(writer,0x20,(uint)__range1);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  iVar4 = BitStreamWriter::getBitsCount(writer);
  uVar5 = my_ntohl(iVar4 / 8 - iVar3 / 8);
  *(uint32_t *)(puVar6 + iVar2 / 8) = uVar5;
  return;
}

Assistant:

void CLPIParser::composeExtentStartPoint(BitStreamWriter& writer) const
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(16, 0);  // reserved
    writer.putBits(16, static_cast<unsigned>(interleaveInfo.size()));

    uint32_t sum = 0;
    for (const auto& i : interleaveInfo)
    {
        sum += i;
        writer.putBits(32, sum);
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}